

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<tinyusdz::value::texcoord3f>
          (AsciiParser *this,char sep,char end_symbol,
          vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_> *result)

{
  pointer *pptVar1;
  pointer ptVar2;
  iterator iVar3;
  StreamReader *pSVar4;
  bool bVar5;
  ulong uVar6;
  char c;
  float3 v;
  char local_61;
  pointer local_60;
  float local_58;
  undefined1 local_50 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  ptVar2 = (result->
           super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((result->
      super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>)
      ._M_impl.super__Vector_impl_data._M_finish != ptVar2) {
    (result->
    super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>).
    _M_impl.super__Vector_impl_data._M_finish = ptVar2;
  }
  bVar5 = SkipWhitespaceAndNewline(this,true);
  if (bVar5) {
    bVar5 = ParseBasicTypeTuple<float,3ul>(this,(array<float,_3UL> *)local_50);
    if (bVar5) {
      local_60 = (pointer)local_50._0_8_;
      local_58 = (float)local_50._8_4_;
    }
    iVar3._M_current =
         (result->
         super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (result->
        super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      ::std::vector<tinyusdz::value::texcoord3f,std::allocator<tinyusdz::value::texcoord3f>>::
      _M_realloc_insert<tinyusdz::value::texcoord3f_const&>
                ((vector<tinyusdz::value::texcoord3f,std::allocator<tinyusdz::value::texcoord3f>> *)
                 result,iVar3,(texcoord3f *)&local_60);
    }
    else {
      (iVar3._M_current)->r = local_58;
      *(pointer *)iVar3._M_current = local_60;
      pptVar1 = &(result->
                 super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *pptVar1 = *pptVar1 + 1;
    }
    while( true ) {
      pSVar4 = this->_sr;
      if ((pSVar4->length_ <= pSVar4->idx_) || (pSVar4->binary_[pSVar4->idx_] == '\0'))
      goto LAB_003b4270;
      bVar5 = SkipCommentAndWhitespaceAndNewline(this,true);
      if (!bVar5) {
        return false;
      }
      bVar5 = Char1(this,&local_61);
      if (!bVar5) {
        return false;
      }
      if (local_61 == sep) {
        bVar5 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar5) {
          return false;
        }
        bVar5 = LookChar1(this,(char *)local_50);
        if (!bVar5) {
          return false;
        }
        if (local_50[0] == end_symbol) goto LAB_003b4270;
      }
      if (local_61 != sep) break;
      bVar5 = SkipWhitespaceAndNewline(this,true);
      if (!bVar5) {
        return false;
      }
      bVar5 = ParseBasicTypeTuple<float,3ul>(this,(array<float,_3UL> *)local_50);
      if (bVar5) {
        local_60 = (pointer)local_50._0_8_;
        local_58 = (float)local_50._8_4_;
      }
      iVar3._M_current =
           (result->
           super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (result->
          super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<tinyusdz::value::texcoord3f,std::allocator<tinyusdz::value::texcoord3f>>::
        _M_realloc_insert<tinyusdz::value::texcoord3f_const&>
                  ((vector<tinyusdz::value::texcoord3f,std::allocator<tinyusdz::value::texcoord3f>>
                    *)result,iVar3,(texcoord3f *)&local_60);
      }
      else {
        (iVar3._M_current)->r = local_58;
        *(pointer *)iVar3._M_current = local_60;
        pptVar1 = &(result->
                   super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *pptVar1 = *pptVar1 + 1;
      }
    }
    pSVar4 = this->_sr;
    if ((0 < (long)pSVar4->idx_) && (uVar6 = pSVar4->idx_ - 1, uVar6 <= pSVar4->length_)) {
      pSVar4->idx_ = uVar6;
    }
LAB_003b4270:
    if ((result->
        super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
        )._M_impl.super__Vector_impl_data._M_start !=
        (result->
        super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      return true;
    }
    local_50._0_8_ = &local_40;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"Empty array.\n","");
    PushError(this,(string *)local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._0_8_ != &local_40) {
      operator_delete((void *)local_50._0_8_,local_40._M_allocated_capacity + 1);
    }
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}